

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,MessageLite *extendee,ExtensionSet *extension_set,int number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  float fVar1;
  double dVar2;
  byte bVar3;
  size_t sVar4;
  unsigned_long uVar5;
  code *UNRECOVERED_JUMPTABLE;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int32_t iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  const_reference pdVar13;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar14;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar15;
  uint *puVar16;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>_> *pVVar17;
  const_reference plVar18;
  double *pdVar19;
  const_reference puVar20;
  ulong *puVar21;
  const_reference puVar22;
  ulong uVar23;
  const_reference pbVar24;
  const_reference pfVar25;
  const_reference piVar26;
  MessageLite *pMVar27;
  uint8_t *puVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  string *extraout_RDX;
  string *s;
  double *ptr;
  byte *pbVar32;
  long lVar33;
  RepeatedPtrFieldBase *this_00;
  size_type __n;
  LogMessageFatal local_40 [16];
  
  if (this->is_repeated == true) {
    if (this->is_packed != true) {
      uVar29 = this->type - 0x13;
      uVar23 = (ulong)uVar29;
      if (0xed < (byte)uVar29) {
        switch(this->type) {
        case '\x01':
          goto switchD_0013d7b7_caseD_1;
        case '\x02':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar23 = (ulong)(number * 8 + 5);
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            pfVar25 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar10);
            fVar1 = *pfVar25;
            uVar30 = uVar23;
            if (0x7f < (uint)(number << 3)) {
              do {
                uVar29 = (uint)uVar30;
                *target = (byte)uVar30 | 0x80;
                uVar30 = uVar30 >> 7;
                target = target + 1;
              } while (0x3fff < uVar29);
            }
            *target = (byte)uVar30;
            *(float *)(target + 1) = fVar1;
            target = target + 5;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x03':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar21 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar10)
            ;
            uVar23 = *puVar21;
            uVar12 = uVar29;
            uVar8 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar8 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar8;
                uVar12 = uVar8 >> 7;
                uVar8 = uVar8 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar12;
            pbVar32 = target + 1;
            uVar30 = uVar23;
            if (0x7f < uVar23) {
              do {
                *pbVar32 = (byte)uVar30 | 0x80;
                uVar23 = uVar30 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar30;
                uVar30 = uVar23;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar23;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x04':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar22 = RepeatedField<unsigned_long>::Get
                                ((RepeatedField<unsigned_long> *)this->field_0,iVar10);
            uVar23 = *puVar22;
            uVar12 = uVar29;
            uVar8 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar8 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar8;
                uVar12 = uVar8 >> 7;
                uVar8 = uVar8 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar12;
            pbVar32 = target + 1;
            uVar30 = uVar23;
            if (0x7f < uVar23) {
              do {
                *pbVar32 = (byte)uVar30 | 0x80;
                uVar23 = uVar30 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar30;
                uVar30 = uVar23;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar23;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x05':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar16 = (uint *)RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
            uVar12 = *puVar16;
            uVar23 = (ulong)(int)uVar12;
            uVar8 = uVar29;
            uVar31 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar31 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar31;
                uVar8 = uVar31 >> 7;
                uVar31 = uVar31 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar8;
            pbVar32 = target + 1;
            uVar30 = uVar23;
            if (0x7f < uVar12) {
              do {
                *pbVar32 = (byte)uVar30 | 0x80;
                uVar23 = uVar30 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar30;
                uVar30 = uVar23;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar23;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x06':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar23 = (ulong)(number * 8 + 1);
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar22 = RepeatedField<unsigned_long>::Get
                                ((RepeatedField<unsigned_long> *)this->field_0,iVar10);
            uVar5 = *puVar22;
            uVar30 = uVar23;
            if (0x7f < (uint)(number << 3)) {
              do {
                uVar29 = (uint)uVar30;
                *target = (byte)uVar30 | 0x80;
                uVar30 = uVar30 >> 7;
                target = target + 1;
              } while (0x3fff < uVar29);
            }
            *target = (byte)uVar30;
            *(unsigned_long *)(target + 1) = uVar5;
            target = target + 9;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\a':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar23 = (ulong)(number * 8 + 5);
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar20 = RepeatedField<unsigned_int>::Get
                                ((RepeatedField<unsigned_int> *)this->field_0,iVar10);
            uVar29 = *puVar20;
            uVar30 = uVar23;
            if (0x7f < (uint)(number << 3)) {
              do {
                uVar12 = (uint)uVar30;
                *target = (byte)uVar30 | 0x80;
                uVar30 = uVar30 >> 7;
                target = target + 1;
              } while (0x3fff < uVar12);
            }
            *target = (byte)uVar30;
            *(uint *)(target + 1) = uVar29;
            target = target + 5;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\b':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            pbVar24 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar10);
            bVar7 = *pbVar24;
            uVar12 = uVar29;
            uVar8 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar8 | 0x80;
                target = target + 1;
                bVar6 = 0x3fff < uVar8;
                uVar12 = uVar8 >> 7;
                uVar8 = uVar8 >> 7;
              } while (bVar6);
            }
            *target = (byte)uVar12;
            target[1] = bVar7;
            target = target + 2;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\t':
          if (*(int *)((this->field_0).int64_t_value + 8) < 1) {
            return target;
          }
          uVar29 = number * 8;
          iVar10 = 0;
          uVar23 = 0xfffffffffffffffc;
          if (0x1fffff < uVar29) {
            uVar23 = (ulong)(uVar29 < 0x10000000) | 0xfffffffffffffffa;
          }
          uVar12 = number * 8 + 2;
          if (uVar29 < 0x4000) {
            uVar23 = (ulong)(uVar29 < 0x80) - 3;
          }
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            pVVar14 = RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                ((RepeatedPtrFieldBase *)this->field_0,iVar10);
            sVar4 = pVVar14->_M_string_length;
            if (((long)sVar4 < 0x80) &&
               ((long)sVar4 <= (long)(stream->end_ + (uVar23 - (long)target) + 0x10))) {
              uVar8 = uVar12;
              uVar31 = uVar12;
              if (0x7f < uVar29) {
                do {
                  *target = (byte)uVar31 | 0x80;
                  target = target + 1;
                  bVar7 = 0x3fff < uVar31;
                  uVar8 = uVar31 >> 7;
                  uVar31 = uVar31 >> 7;
                } while (bVar7);
              }
              *target = (byte)uVar8;
              target[1] = (byte)sVar4;
              memcpy(target + 2,(pVVar14->_M_dataplus)._M_p,sVar4);
              target = target + sVar4 + 2;
            }
            else {
              target = io::EpsCopyOutputStream::WriteStringOutline(stream,number,pVVar14,target);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < *(int *)((this->field_0).int64_t_value + 8));
          return target;
        case '\n':
          if (*(int *)((this->field_0).int64_t_value + 8) < 1) {
            return target;
          }
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            pVVar17 = RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                                ((RepeatedPtrFieldBase *)this->field_0,iVar10);
            target = WireFormatLite::InternalWriteGroup(number,pVVar17,target,stream);
            iVar10 = iVar10 + 1;
          } while (iVar10 < *(int *)((this->field_0).int64_t_value + 8));
          return target;
        case '\v':
          this_00 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
          if (this_00->current_size_ < 1) {
            return target;
          }
          iVar10 = 0;
          do {
            pVVar17 = RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                                (this_00,iVar10);
            iVar11 = MessageLite::GetCachedSize(pVVar17);
            target = WireFormatLite::InternalWriteMessage(number,pVVar17,iVar11,target,stream);
            iVar10 = iVar10 + 1;
            this_00 = (RepeatedPtrFieldBase *)(this->field_0).int64_t_value;
          } while (iVar10 < this_00->current_size_);
          return target;
        case '\f':
          if (*(int *)((this->field_0).int64_t_value + 8) < 1) {
            return target;
          }
          uVar29 = number * 8;
          iVar10 = 0;
          uVar23 = 0xfffffffffffffffc;
          if (0x1fffff < uVar29) {
            uVar23 = (ulong)(uVar29 < 0x10000000) | 0xfffffffffffffffa;
          }
          uVar12 = number * 8 + 2;
          if (uVar29 < 0x4000) {
            uVar23 = (ulong)(uVar29 < 0x80) - 3;
          }
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            pVVar14 = RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                                ((RepeatedPtrFieldBase *)this->field_0,iVar10);
            sVar4 = pVVar14->_M_string_length;
            if (((long)sVar4 < 0x80) &&
               ((long)sVar4 <= (long)(stream->end_ + (uVar23 - (long)target) + 0x10))) {
              uVar8 = uVar12;
              uVar31 = uVar12;
              if (0x7f < uVar29) {
                do {
                  *target = (byte)uVar31 | 0x80;
                  target = target + 1;
                  bVar7 = 0x3fff < uVar31;
                  uVar8 = uVar31 >> 7;
                  uVar31 = uVar31 >> 7;
                } while (bVar7);
              }
              *target = (byte)uVar8;
              target[1] = (byte)sVar4;
              memcpy(target + 2,(pVVar14->_M_dataplus)._M_p,sVar4);
              target = target + sVar4 + 2;
            }
            else {
              target = io::EpsCopyOutputStream::WriteStringOutline(stream,number,pVVar14,target);
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < *(int *)((this->field_0).int64_t_value + 8));
          return target;
        case '\r':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar20 = RepeatedField<unsigned_int>::Get
                                ((RepeatedField<unsigned_int> *)this->field_0,iVar10);
            uVar12 = *puVar20;
            uVar8 = uVar29;
            uVar31 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar31 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar31;
                uVar8 = uVar31 >> 7;
                uVar31 = uVar31 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar8;
            pbVar32 = target + 1;
            uVar8 = uVar12;
            if (0x7f < uVar12) {
              do {
                *pbVar32 = (byte)uVar8 | 0x80;
                uVar12 = uVar8 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar8;
                uVar8 = uVar12;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar12;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x0e':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            puVar16 = (uint *)RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
            uVar12 = *puVar16;
            uVar23 = (ulong)(int)uVar12;
            uVar8 = uVar29;
            uVar31 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar31 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar31;
                uVar8 = uVar31 >> 7;
                uVar31 = uVar31 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar8;
            pbVar32 = target + 1;
            uVar30 = uVar23;
            if (0x7f < uVar12) {
              do {
                *pbVar32 = (byte)uVar30 | 0x80;
                uVar23 = uVar30 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar30;
                uVar30 = uVar23;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar23;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x0f':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar23 = (ulong)(number * 8 + 5);
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            piVar26 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
            iVar11 = *piVar26;
            uVar30 = uVar23;
            if (0x7f < (uint)(number << 3)) {
              do {
                uVar29 = (uint)uVar30;
                *target = (byte)uVar30 | 0x80;
                uVar30 = uVar30 >> 7;
                target = target + 1;
              } while (0x3fff < uVar29);
            }
            *target = (byte)uVar30;
            *(int *)(target + 1) = iVar11;
            target = target + 5;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x10':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar23 = (ulong)(number * 8 + 1);
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            plVar18 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar10);
            lVar33 = *plVar18;
            uVar30 = uVar23;
            if (0x7f < (uint)(number << 3)) {
              do {
                uVar29 = (uint)uVar30;
                *target = (byte)uVar30 | 0x80;
                uVar30 = uVar30 >> 7;
                target = target + 1;
              } while (0x3fff < uVar29);
            }
            *target = (byte)uVar30;
            *(long *)(target + 1) = lVar33;
            target = target + 9;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x11':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            piVar26 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
            iVar11 = *piVar26;
            uVar12 = uVar29;
            uVar8 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar8 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar8;
                uVar12 = uVar8 >> 7;
                uVar8 = uVar8 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar12;
            pbVar32 = target + 1;
            uVar8 = iVar11 >> 0x1f ^ iVar11 * 2;
            uVar12 = uVar8;
            if (0x7f < uVar8) {
              do {
                *pbVar32 = (byte)uVar12 | 0x80;
                uVar8 = uVar12 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar12;
                uVar12 = uVar8;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar8;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        case '\x12':
          iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar10 < 1) {
            return target;
          }
          uVar29 = number << 3;
          iVar10 = 0;
          do {
            if (stream->end_ <= target) {
              target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
            }
            plVar18 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar10);
            lVar33 = *plVar18;
            uVar12 = uVar29;
            uVar8 = uVar29;
            if (0x7f < uVar29) {
              do {
                *target = (byte)uVar8 | 0x80;
                target = target + 1;
                bVar7 = 0x3fff < uVar8;
                uVar12 = uVar8 >> 7;
                uVar8 = uVar8 >> 7;
              } while (bVar7);
            }
            *target = (byte)uVar12;
            pbVar32 = target + 1;
            uVar30 = lVar33 >> 0x3f ^ lVar33 * 2;
            uVar23 = uVar30;
            if (0x7f < uVar30) {
              do {
                *pbVar32 = (byte)uVar23 | 0x80;
                uVar30 = uVar23 >> 7;
                pbVar32 = pbVar32 + 1;
                bVar7 = 0x3fff < uVar23;
                uVar23 = uVar30;
              } while (bVar7);
            }
            *pbVar32 = (byte)uVar30;
            target = pbVar32 + 1;
            iVar10 = iVar10 + 1;
            iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                  (undefined1  [16])
                                  ((undefined1  [16])
                                   ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                  (undefined1  [16])0x4) == (undefined1  [16])0x0);
          } while (iVar10 < iVar11);
          return target;
        default:
          return target;
        }
      }
      goto LAB_0013eef5;
    }
    if (*(int *)(this->cached_size).int_ == 0) {
      return target;
    }
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar30 = (ulong)(number * 8 + 2);
    uVar23 = uVar30;
    if (0x7f < (uint)(number << 3)) goto LAB_0013eeff;
LAB_0013d671:
    *target = (byte)uVar30;
    target = target + 1;
    uVar29 = *(uint *)(this->cached_size).int_;
    uVar30 = (ulong)(int)uVar29;
    uVar23 = uVar30;
    if (0x7f < uVar29) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar30 = uVar23 >> 7;
        target = target + 1;
        bVar7 = 0x3fff < uVar23;
        uVar23 = uVar30;
      } while (bVar7);
    }
    *target = (byte)uVar30;
    if (0xed < (byte)(this->type - 0x13)) {
      ptr = (double *)(target + 1);
      switch(this->type) {
      case '\x01':
        goto switchD_0013d6bb_caseD_1;
      case '\x02':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pfVar25 = RepeatedField<float>::Get((RepeatedField<float> *)this->field_0,iVar10);
          *(float *)ptr = *pfVar25;
          ptr = (double *)((long)ptr + 4);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x03':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar21 = (ulong *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar10);
          uVar23 = *puVar21;
          uVar30 = uVar23;
          if (0x7f < uVar23) {
            do {
              *(byte *)ptr = (byte)uVar30 | 0x80;
              uVar23 = uVar30 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar30;
              uVar30 = uVar23;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar23;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x04':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar22 = RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar10);
          uVar23 = *puVar22;
          uVar30 = uVar23;
          if (0x7f < uVar23) {
            do {
              *(byte *)ptr = (byte)uVar30 | 0x80;
              uVar23 = uVar30 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar30;
              uVar30 = uVar23;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar23;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x05':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar26 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
          uVar30 = (ulong)*piVar26;
          uVar23 = uVar30;
          if (0x7f < uVar30) {
            do {
              *(byte *)ptr = (byte)uVar23 | 0x80;
              uVar30 = uVar23 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar23;
              uVar23 = uVar30;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar30;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x06':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pdVar19 = (double *)
                    RepeatedField<unsigned_long>::Get
                              ((RepeatedField<unsigned_long> *)this->field_0,iVar10);
          *ptr = *pdVar19;
          ptr = ptr + 1;
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\a':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar20 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar10);
          *(uint *)ptr = *puVar20;
          ptr = (double *)((long)ptr + 4);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\b':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pbVar24 = RepeatedField<bool>::Get((RepeatedField<bool> *)this->field_0,iVar10);
          *(bool *)ptr = *pbVar24;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\t':
      case '\n':
      case '\v':
      case '\f':
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
                   ,0x70c);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  ((LogMessage *)local_40,(char (*) [37])"Non-primitive types can\'t be packed.");
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      case '\r':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          puVar20 = RepeatedField<unsigned_int>::Get
                              ((RepeatedField<unsigned_int> *)this->field_0,iVar10);
          uVar29 = *puVar20;
          uVar12 = uVar29;
          if (0x7f < uVar29) {
            do {
              *(byte *)ptr = (byte)uVar12 | 0x80;
              uVar29 = uVar12 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar12;
              uVar12 = uVar29;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar29;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x0e':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar26 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
          uVar30 = (ulong)*piVar26;
          uVar23 = uVar30;
          if (0x7f < uVar30) {
            do {
              *(byte *)ptr = (byte)uVar23 | 0x80;
              uVar30 = uVar23 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar23;
              uVar23 = uVar30;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar30;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x0f':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar26 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
          *(int *)ptr = *piVar26;
          ptr = (double *)((long)ptr + 4);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x10':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          pdVar19 = (double *)RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar10);
          *ptr = *pdVar19;
          ptr = ptr + 1;
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x11':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          piVar26 = RepeatedField<int>::Get((RepeatedField<int> *)this->field_0,iVar10);
          uVar12 = *piVar26 >> 0x1f ^ *piVar26 * 2;
          uVar29 = uVar12;
          if (0x7f < uVar12) {
            do {
              *(byte *)ptr = (byte)uVar29 | 0x80;
              uVar12 = uVar29 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar29;
              uVar29 = uVar12;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar12;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      case '\x12':
        iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                              (undefined1  [16])
                              ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0
                              & (undefined1  [16])0x4) == (undefined1  [16])0x0);
        if (iVar10 < 1) {
          return (uint8_t *)ptr;
        }
        iVar10 = 0;
        do {
          if (stream->end_ <= ptr) {
            ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
          }
          plVar18 = RepeatedField<long>::Get((RepeatedField<long> *)this->field_0,iVar10);
          uVar30 = *plVar18 >> 0x3f ^ *plVar18 * 2;
          uVar23 = uVar30;
          if (0x7f < uVar30) {
            do {
              *(byte *)ptr = (byte)uVar23 | 0x80;
              uVar30 = uVar23 >> 7;
              ptr = (double *)((long)ptr + 1);
              bVar7 = 0x3fff < uVar23;
              uVar23 = uVar30;
            } while (bVar7);
          }
          *(char *)ptr = (char)uVar30;
          ptr = (double *)((long)ptr + 1);
          iVar10 = iVar10 + 1;
          iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                                (undefined1  [16])
                                ((undefined1  [16])
                                 ((SooRep *)(this->field_0).int64_t_value)->field_0 &
                                (undefined1  [16])0x4) == (undefined1  [16])0x0);
        } while (iVar10 < iVar11);
        return (uint8_t *)ptr;
      default:
        return (uint8_t *)ptr;
      }
    }
    InternalSerializeFieldWithCachedSizesToArray();
    s = extraout_RDX;
    goto LAB_0013ef5e;
  }
  if ((this->field_0xa & 2) != 0) {
    return target;
  }
  bVar3 = this->type;
  uVar23 = (ulong)bVar3;
  if ((byte)(bVar3 - 0x13) < 0xee) {
    InternalSerializeFieldWithCachedSizesToArray();
LAB_0013eef5:
    InternalSerializeFieldWithCachedSizesToArray();
LAB_0013eeff:
    uVar30 = uVar23 & 0xffffffff;
    do {
      uVar29 = (uint)uVar23;
      *target = (byte)uVar23 | 0x80;
      uVar30 = uVar30 >> 7;
      target = target + 1;
      uVar23 = uVar30;
    } while (0x3fff < uVar29);
    goto LAB_0013d671;
  }
  switch(bVar3) {
  case 1:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    aVar15 = this->field_0;
    uVar23 = (ulong)(number * 8 + 1);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar23;
        *target = (byte)uVar23 | 0x80;
        uVar23 = uVar23 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar23;
    *(anon_union_8_9_fdc4a54a_for_Extension_0 *)(target + 1) = aVar15;
    goto LAB_0013e3ec;
  case 2:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = (this->field_0).int32_t_value;
    uVar23 = (ulong)(number * 8 + 5);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar23;
        *target = (byte)uVar23 | 0x80;
        uVar23 = uVar23 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar23;
    *(int32_t *)(target + 1) = iVar9;
    goto LAB_0013e5a9;
  case 3:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar23 = (this->field_0).uint64_t_value;
    uVar12 = number << 3;
    uVar29 = uVar12;
    if (0x7f < uVar12) {
      do {
        *target = (byte)uVar29 | 0x80;
        uVar12 = uVar29 >> 7;
        target = target + 1;
        bVar7 = 0x3fff < uVar29;
        uVar29 = uVar12;
      } while (bVar7);
    }
    *target = (byte)uVar12;
    pbVar32 = target + 1;
    uVar30 = uVar23;
    if (0x7f < uVar23) {
      do {
        *pbVar32 = (byte)uVar30 | 0x80;
        uVar23 = uVar30 >> 7;
        pbVar32 = pbVar32 + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar23;
      } while (bVar7);
    }
    break;
  case 4:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar23 = (this->field_0).uint64_t_value;
    uVar12 = number << 3;
    uVar29 = uVar12;
    if (0x7f < uVar12) {
      do {
        *target = (byte)uVar29 | 0x80;
        uVar12 = uVar29 >> 7;
        target = target + 1;
        bVar7 = 0x3fff < uVar29;
        uVar29 = uVar12;
      } while (bVar7);
    }
    *target = (byte)uVar12;
    pbVar32 = target + 1;
    uVar30 = uVar23;
    if (0x7f < uVar23) {
      do {
        *pbVar32 = (byte)uVar30 | 0x80;
        uVar23 = uVar30 >> 7;
        pbVar32 = pbVar32 + 1;
        bVar7 = 0x3fff < uVar30;
        uVar30 = uVar23;
      } while (bVar7);
    }
    break;
  case 5:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar28 = WireFormatLite::WriteInt32ToArray(number,(this->field_0).int32_t_value,target);
    return puVar28;
  case 6:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    aVar15 = this->field_0;
    uVar23 = (ulong)(number * 8 + 1);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar23;
        *target = (byte)uVar23 | 0x80;
        uVar23 = uVar23 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    goto LAB_0013e3e6;
  case 7:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = (this->field_0).int32_t_value;
    uVar23 = (ulong)(number * 8 + 5);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar23;
        *target = (byte)uVar23 | 0x80;
        uVar23 = uVar23 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    goto LAB_0013e5a4;
  case 8:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar7 = (this->field_0).bool_value;
    uVar12 = number << 3;
    uVar29 = uVar12;
    if (0x7f < uVar12) {
      do {
        *target = (byte)uVar29 | 0x80;
        uVar12 = uVar29 >> 7;
        target = target + 1;
        bVar6 = 0x3fff < uVar29;
        uVar29 = uVar12;
      } while (bVar6);
    }
    *target = (byte)uVar12;
    target[1] = bVar7;
    return target + 2;
  case 9:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    s = (string *)(this->field_0).int64_t_value;
    __n = s->_M_string_length;
    if ((long)__n < 0x80) {
      uVar29 = number * 8;
      lVar33 = 1;
      if (((0x7f < uVar29) && (lVar33 = 2, 0x3fff < uVar29)) && (lVar33 = 3, 0x1fffff < uVar29)) {
        lVar33 = 5 - (ulong)(uVar29 < 0x10000000);
      }
      if ((long)__n <= (long)(stream->end_ + ~(ulong)(target + lVar33) + 0x10)) {
        uVar8 = uVar29 | 2;
        uVar12 = uVar8;
        if (0x7f < uVar29) {
          do {
            *target = (byte)uVar12 | 0x80;
            uVar8 = uVar12 >> 7;
            target = target + 1;
            bVar7 = 0x3fff < uVar12;
            uVar12 = uVar8;
          } while (bVar7);
        }
LAB_0013e748:
        *target = (byte)uVar8;
        target[1] = (byte)__n;
        memcpy(target + 2,(s->_M_dataplus)._M_p,__n);
        return target + __n + 2;
      }
    }
    goto LAB_0013ef5e;
  case 10:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar28 = WireFormatLite::InternalWriteGroup(number,(MessageLite *)this->field_0,target,stream);
    return puVar28;
  case 0xb:
    if ((this->field_0xa & 4) == 0) {
      aVar15 = this->field_0;
      iVar10 = MessageLite::GetCachedSize(aVar15);
      puVar28 = WireFormatLite::InternalWriteMessage
                          (number,(MessageLite *)aVar15,iVar10,target,stream);
      return puVar28;
    }
    pMVar27 = GetPrototypeForLazyMessage(extension_set,extendee,number);
    UNRECOVERED_JUMPTABLE = *(code **)(**(long **)&(this->field_0).int32_t_value + 0x98);
    puVar28 = (uint8_t *)
              (*UNRECOVERED_JUMPTABLE)
                        (*(long **)&(this->field_0).int32_t_value,pMVar27,number,target,stream,
                         UNRECOVERED_JUMPTABLE);
    return puVar28;
  case 0xc:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    s = (string *)(this->field_0).int64_t_value;
    __n = s->_M_string_length;
    if ((long)__n < 0x80) {
      uVar29 = number * 8;
      lVar33 = 1;
      if (((0x7f < uVar29) && (lVar33 = 2, 0x3fff < uVar29)) && (lVar33 = 3, 0x1fffff < uVar29)) {
        lVar33 = 5 - (ulong)(uVar29 < 0x10000000);
      }
      if ((long)__n <= (long)(stream->end_ + ~(ulong)(target + lVar33) + 0x10)) {
        uVar8 = uVar29 | 2;
        uVar12 = uVar8;
        if (0x7f < uVar29) {
          do {
            *target = (byte)uVar12 | 0x80;
            uVar8 = uVar12 >> 7;
            target = target + 1;
            bVar7 = 0x3fff < uVar12;
            uVar12 = uVar8;
          } while (bVar7);
        }
        goto LAB_0013e748;
      }
    }
LAB_0013ef5e:
    puVar28 = io::EpsCopyOutputStream::WriteStringOutline(stream,number,s,target);
    return puVar28;
  case 0xd:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar29 = (this->field_0).uint32_t_value;
    uVar8 = number << 3;
    uVar12 = uVar8;
    if (0x7f < uVar8) {
      do {
        *target = (byte)uVar12 | 0x80;
        uVar8 = uVar12 >> 7;
        target = target + 1;
        bVar7 = 0x3fff < uVar12;
        uVar12 = uVar8;
      } while (bVar7);
    }
    *target = (byte)uVar8;
    pbVar32 = target + 1;
    uVar12 = uVar29;
    if (0x7f < uVar29) {
      do {
        *pbVar32 = (byte)uVar12 | 0x80;
        uVar29 = uVar12 >> 7;
        pbVar32 = pbVar32 + 1;
        bVar7 = 0x3fff < uVar12;
        uVar12 = uVar29;
      } while (bVar7);
    }
    *pbVar32 = (byte)uVar29;
    goto LAB_0013e06a;
  case 0xe:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar28 = WireFormatLite::WriteEnumToArray(number,(this->field_0).enum_value,target);
    return puVar28;
  case 0xf:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    iVar9 = (this->field_0).int32_t_value;
    uVar23 = (ulong)(number * 8 + 5);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar23;
        *target = (byte)uVar23 | 0x80;
        uVar23 = uVar23 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
LAB_0013e5a4:
    *target = (byte)uVar23;
    *(int32_t *)(target + 1) = iVar9;
LAB_0013e5a9:
    return target + 5;
  case 0x10:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    aVar15 = this->field_0;
    uVar23 = (ulong)(number * 8 + 1);
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar23;
        *target = (byte)uVar23 | 0x80;
        uVar23 = uVar23 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
LAB_0013e3e6:
    *target = (byte)uVar23;
    *(anon_union_8_9_fdc4a54a_for_Extension_0 *)(target + 1) = aVar15;
LAB_0013e3ec:
    return target + 9;
  case 0x11:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar28 = WireFormatLite::WriteSInt32ToArray(number,(this->field_0).int32_t_value,target);
    return puVar28;
  case 0x12:
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    puVar28 = WireFormatLite::WriteSInt64ToArray(number,(this->field_0).int64_t_value,target);
    return puVar28;
  default:
    goto switchD_0013d6bb_default;
  }
  *pbVar32 = (byte)uVar23;
LAB_0013e06a:
  target = pbVar32 + 1;
switchD_0013d6bb_default:
  return target;
switchD_0013d7b7_caseD_1:
  iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                        (undefined1  [16])
                        ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                        (undefined1  [16])0x4) == (undefined1  [16])0x0);
  if (iVar10 < 1) {
    return target;
  }
  uVar23 = (ulong)(number * 8 + 1);
  iVar10 = 0;
  do {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    pdVar13 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar10);
    dVar2 = *pdVar13;
    uVar30 = uVar23;
    if (0x7f < (uint)(number << 3)) {
      do {
        uVar29 = (uint)uVar30;
        *target = (byte)uVar30 | 0x80;
        uVar30 = uVar30 >> 7;
        target = target + 1;
      } while (0x3fff < uVar29);
    }
    *target = (byte)uVar30;
    *(double *)(target + 1) = dVar2;
    target = target + 9;
    iVar10 = iVar10 + 1;
    iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
  } while (iVar10 < iVar11);
  return target;
switchD_0013d6bb_caseD_1:
  iVar10 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                        (undefined1  [16])
                        ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                        (undefined1  [16])0x4) == (undefined1  [16])0x0);
  if (iVar10 < 1) {
    return (uint8_t *)ptr;
  }
  iVar10 = 0;
  do {
    if (stream->end_ <= ptr) {
      ptr = (double *)io::EpsCopyOutputStream::EnsureSpaceFallback(stream,(uint8_t *)ptr);
    }
    pdVar13 = RepeatedField<double>::Get((RepeatedField<double> *)this->field_0,iVar10);
    *ptr = *pdVar13;
    ptr = ptr + 1;
    iVar10 = iVar10 + 1;
    iVar11 = SooRep::size((SooRep *)(this->field_0).int64_t_value,
                          (undefined1  [16])
                          ((undefined1  [16])((SooRep *)(this->field_0).int64_t_value)->field_0 &
                          (undefined1  [16])0x4) == (undefined1  [16])0x0);
  } while (iVar10 < iVar11);
  return (uint8_t *)ptr;
}

Assistant:

uint8_t* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    const MessageLite* extendee, const ExtensionSet* extension_set, int number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size() == 0) return target;

      target = stream->EnsureSpace(target);
      target = WireFormatLite::WriteTagToArray(
          number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size(), target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##NoTagToArray(           \
          ptr.repeated_##LOWERCASE##_value->Get(i), target);             \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = WireFormatLite::Write##CAMELCASE##ToArray(                \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break

        HANDLE_TYPE(INT32, Int32, int32_t);
        HANDLE_TYPE(INT64, Int64, int64_t);
        HANDLE_TYPE(UINT32, UInt32, uint32_t);
        HANDLE_TYPE(UINT64, UInt64, uint64_t);
        HANDLE_TYPE(SINT32, SInt32, int32_t);
        HANDLE_TYPE(SINT64, SInt64, int64_t);
        HANDLE_TYPE(FIXED32, Fixed32, uint32_t);
        HANDLE_TYPE(FIXED64, Fixed64, uint64_t);
        HANDLE_TYPE(SFIXED32, SFixed32, int32_t);
        HANDLE_TYPE(SFIXED64, SFixed64, int64_t);
        HANDLE_TYPE(FLOAT, Float, float);
        HANDLE_TYPE(DOUBLE, Double, double);
        HANDLE_TYPE(BOOL, Bool, bool);
        HANDLE_TYPE(ENUM, Enum, enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                     \
  case WireFormatLite::TYPE_##UPPERCASE:                                 \
    for (int i = 0; i < ptr.repeated_##LOWERCASE##_value->size(); i++) { \
      target = stream->EnsureSpace(target);                              \
      target = stream->WriteString(                                      \
          number, ptr.repeated_##LOWERCASE##_value->Get(i), target);     \
    }                                                                    \
    break
        HANDLE_TYPE(STRING, String, string);
        HANDLE_TYPE(BYTES, Bytes, string);
#undef HANDLE_TYPE
        case WireFormatLite::TYPE_GROUP:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            target = stream->EnsureSpace(target);
            target = WireFormatLite::InternalWriteGroup(
                number, ptr.repeated_message_value->Get(i), target, stream);
          }
          break;
        case WireFormatLite::TYPE_MESSAGE:
          for (int i = 0; i < ptr.repeated_message_value->size(); i++) {
            auto& msg = ptr.repeated_message_value->Get(i);
            target = WireFormatLite::InternalWriteMessage(
                number, msg, msg.GetCachedSize(), target, stream);
          }
          break;
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                               \
  case WireFormatLite::TYPE_##UPPERCASE:                                       \
    target = stream->EnsureSpace(target);                                      \
    target = WireFormatLite::Write##CAMELCASE##ToArray(number, VALUE, target); \
    break

      HANDLE_TYPE(INT32, Int32, int32_t_value);
      HANDLE_TYPE(INT64, Int64, int64_t_value);
      HANDLE_TYPE(UINT32, UInt32, uint32_t_value);
      HANDLE_TYPE(UINT64, UInt64, uint64_t_value);
      HANDLE_TYPE(SINT32, SInt32, int32_t_value);
      HANDLE_TYPE(SINT64, SInt64, int64_t_value);
      HANDLE_TYPE(FIXED32, Fixed32, uint32_t_value);
      HANDLE_TYPE(FIXED64, Fixed64, uint64_t_value);
      HANDLE_TYPE(SFIXED32, SFixed32, int32_t_value);
      HANDLE_TYPE(SFIXED64, SFixed64, int64_t_value);
      HANDLE_TYPE(FLOAT, Float, float_value);
      HANDLE_TYPE(DOUBLE, Double, double_value);
      HANDLE_TYPE(BOOL, Bool, bool_value);
      HANDLE_TYPE(ENUM, Enum, enum_value);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)         \
  case WireFormatLite::TYPE_##UPPERCASE:                 \
    target = stream->EnsureSpace(target);                \
    target = stream->WriteString(number, VALUE, target); \
    break
      HANDLE_TYPE(STRING, String, *ptr.string_value);
      HANDLE_TYPE(BYTES, Bytes, *ptr.string_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_GROUP:
        target = stream->EnsureSpace(target);
        target = WireFormatLite::InternalWriteGroup(number, *ptr.message_value,
                                                    target, stream);
        break;
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          const auto* prototype =
              extension_set->GetPrototypeForLazyMessage(extendee, number);
          target = ptr.lazymessage_value->WriteMessageToArray(prototype, number,
                                                              target, stream);
        } else {
          target = WireFormatLite::InternalWriteMessage(
              number, *ptr.message_value, ptr.message_value->GetCachedSize(),
              target, stream);
        }
        break;
    }
  }
  return target;
}